

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O3

Character ZXing::OneD::ReadDataCharacter(PatternView *view,bool outsideChar,bool rightPair)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Character CVar5;
  int iVar6;
  long lVar7;
  undefined7 in_register_00000031;
  Array4I evnPattern;
  Array4I oddPattern;
  undefined8 uStack_50;
  Array4I local_48;
  Array4I local_38;
  
  local_38._M_elems[0] = 0;
  local_38._M_elems[1] = 0;
  local_38._M_elems[2] = 0;
  local_38._M_elems[3] = 0;
  local_48._M_elems[0] = 0;
  local_48._M_elems[1] = 0;
  local_48._M_elems[2] = 0;
  local_48._M_elems[3] = 0;
  uStack_50 = 0x15ea56;
  bVar1 = DataBar::ReadDataCharacterRaw
                    (view,(int)CONCAT71(in_register_00000031,outsideChar) + 0xf,
                     rightPair == outsideChar,&local_38,&local_48);
  CVar5.value = -1;
  CVar5.checksum = 0;
  if (bVar1) {
    iVar2 = 0;
    lVar7 = 0x10;
    do {
      iVar2 = iVar2 * 9 + *(int *)((long)local_48._M_elems + lVar7 + 0xc);
      lVar7 = lVar7 + -4;
    } while (lVar7 != 0);
    iVar6 = 0;
    lVar7 = 0x10;
    do {
      iVar6 = iVar6 * 9 + *(int *)((long)local_48._M_elems + lVar7 + -4);
      lVar7 = lVar7 + -4;
    } while (lVar7 != 0);
    if (outsideChar) {
      lVar7 = (long)((0xc - (local_38._M_elems[3] + local_38._M_elems[1] +
                            local_38._M_elems[2] + local_38._M_elems[0])) / 2);
      iVar4 = *(int *)(&DAT_00196b10 + lVar7 * 4);
      uStack_50 = 0x15eae3;
      iVar3 = DataBar::GetValue(&local_38,iVar4,false);
      uStack_50 = 0x15eaf4;
      iVar4 = DataBar::GetValue(&local_48,9 - iVar4,true);
      iVar4 = iVar3 * *(int *)(&DAT_00196ad0 + lVar7 * 4) + iVar4 +
              *(int *)(&DAT_00196af0 + lVar7 * 4);
    }
    else {
      lVar7 = (long)((10 - (local_48._M_elems[3] + local_48._M_elems[1] +
                           local_48._M_elems[2] + local_48._M_elems[0])) / 2);
      iVar4 = *(int *)(&DAT_001969d0 + lVar7 * 4);
      uStack_50 = 0x15eb60;
      iVar3 = DataBar::GetValue(&local_38,iVar4,true);
      uStack_50 = 0x15eb6f;
      iVar4 = DataBar::GetValue(&local_48,9 - iVar4,false);
      iVar4 = iVar4 * *(int *)(&DAT_001969b0 + lVar7 * 4) + iVar3 +
              *(int *)(&DAT_001969c0 + lVar7 * 4);
    }
    CVar5.checksum = iVar6 * 3 + iVar2;
    CVar5.value = iVar4;
  }
  return CVar5;
}

Assistant:

static Character ReadDataCharacter(const PatternView& view, bool outsideChar, bool rightPair)
{
	constexpr int OUTSIDE_EVEN_TOTAL_SUBSET[] = {1, 10, 34, 70, 126};
	constexpr int INSIDE_ODD_TOTAL_SUBSET[]   = {4, 20, 48, 81};
	constexpr int OUTSIDE_GSUM[]              = {0, 161, 961, 2015, 2715};
	constexpr int INSIDE_GSUM[]               = {0, 336, 1036, 1516};
	constexpr int OUTSIDE_ODD_WIDEST[]        = {8, 6, 4, 3, 1};
	constexpr int INSIDE_ODD_WIDEST[]         = {2, 4, 6, 8};

	Array4I oddPattern = {}, evnPattern = {};
	if (!ReadDataCharacterRaw(view, outsideChar ? 16 : 15, outsideChar == rightPair, oddPattern, evnPattern))
		return {};

	auto calcChecksumPortion = [](const Array4I& counts) {
		int res = 0;
		for (auto it = counts.rbegin(); it != counts.rend(); ++it)
			res = 9 * res + *it;
		return res;
	};

	int checksumPortion = calcChecksumPortion(oddPattern) + 3 * calcChecksumPortion(evnPattern);

	if (outsideChar) {
		int oddSum = Reduce(oddPattern);
		assert((oddSum & 1) == 0 && oddSum <= 12 && oddSum >= 4); // checked in ReadDataCharacterRaw
		int group = (12 - oddSum) / 2;
		int oddWidest = OUTSIDE_ODD_WIDEST[group];
		int evnWidest = 9 - oddWidest;
		int vOdd = GetValue(oddPattern, oddWidest, false);
		int vEvn = GetValue(evnPattern, evnWidest, true);
		int tEvn = OUTSIDE_EVEN_TOTAL_SUBSET[group];
		int gSum = OUTSIDE_GSUM[group];
		return {vOdd * tEvn + vEvn + gSum, checksumPortion};
	} else {
		int evnSum = Reduce(evnPattern);
		assert((evnSum & 1) == 0 && evnSum <= 12 && evnSum >= 4); // checked in ReadDataCharacterRaw
		int group = (10 - evnSum) / 2;
		int oddWidest = INSIDE_ODD_WIDEST[group];
		int evnWidest = 9 - oddWidest;
		int vOdd = GetValue(oddPattern, oddWidest, true);
		int vEvn = GetValue(evnPattern, evnWidest, false);
		int tOdd = INSIDE_ODD_TOTAL_SUBSET[group];
		int gSum = INSIDE_GSUM[group];
		return {vEvn * tOdd + vOdd + gSum, checksumPortion};
	}
}